

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__decode_samples_with_residual
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 blockSize,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pDecodedSamples)

{
  ma_uint8 mVar1;
  ma_bool32 mVar2;
  ma_bool32 mVar3;
  long lVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ma_int32 *pResult;
  ma_uint8 riceParam;
  ma_uint8 unencodedBitsPerSample;
  byte local_7e;
  ma_uint8 partitionOrder;
  uint local_7c;
  ma_uint8 residualMethod;
  uint local_74;
  ma_int32 *local_70;
  uint local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_7c = lpcShift;
  mVar2 = ma_dr_flac__read_uint8(bs,2,&residualMethod);
  mVar3 = CONCAT31((int3)(mVar2 >> 8),mVar2 == 0);
  if (((residualMethod < 2 && mVar2 != 0) &&
      (mVar3 = ma_dr_flac__read_uint8(bs,4,&partitionOrder), mVar3 != 0)) &&
     (local_74 = (uint)partitionOrder, local_74 < 9)) {
    local_68 = blockSize >> (partitionOrder & 0x1f);
    mVar3 = local_68 - lpcOrder;
    if (lpcOrder <= local_68) {
      iVar8 = 1 << (partitionOrder & 0x1f);
      local_70 = pDecodedSamples + lpcOrder;
      uVar9 = 0x1f;
      if (lpcOrder != 0) {
        for (; lpcOrder >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      iVar5 = (uVar9 ^ 0xffffffe0) + 0x21;
      local_38 = (ulong)local_7c;
      if (lpcOrder == 0) {
        iVar5 = 0;
      }
      local_5c = iVar5 + lpcPrecision + bitsPerSample;
      local_7e = residualMethod;
      bVar6 = residualMethod;
      local_50 = (ulong)bitsPerSample;
      local_48 = (ulong)lpcOrder;
      local_40 = (ulong)lpcPrecision;
      do {
        riceParam = '\0';
        local_58 = (ulong)mVar3;
        if ((bVar6 & 1) == 0) {
          mVar2 = ma_dr_flac__read_uint8(bs,4,&riceParam);
          if (mVar2 == 0) {
            return 0;
          }
          if (riceParam == '\x0f') goto LAB_00168132;
LAB_001680d3:
          if (riceParam == 0xff) goto LAB_00168137;
          mVar2 = ma_dr_flac__decode_samples_with_residual__rice__scalar
                            (bs,(ma_uint32)local_50,mVar3,riceParam,(ma_uint32)local_48,local_7c,
                             (ma_uint32)local_40,coefficients,local_70);
          if (mVar2 == 0) {
            return 0;
          }
        }
        else {
          mVar2 = ma_dr_flac__read_uint8(bs,5,&riceParam);
          if (mVar2 == 0) {
            return 0;
          }
          if (riceParam != '\x1f') goto LAB_001680d3;
LAB_00168132:
          riceParam = 0xff;
LAB_00168137:
          unencodedBitsPerSample = '\0';
          mVar2 = ma_dr_flac__read_uint8(bs,5,&unencodedBitsPerSample);
          mVar1 = unencodedBitsPerSample;
          if (mVar2 == 0) {
            return 0;
          }
          bVar6 = local_7e;
          local_64 = iVar8;
          local_60 = mVar3;
          if (mVar3 != 0) {
            uVar9 = (uint)unencodedBitsPerSample;
            uVar7 = local_58;
            pResult = local_70;
            do {
              if (mVar1 == '\0') {
                *pResult = 0;
              }
              else {
                mVar3 = ma_dr_flac__read_int32(bs,uVar9,pResult);
                if (mVar3 == 0) {
                  return 0;
                }
              }
              if (local_5c < 0x21) {
                iVar8 = 0;
                switch(lpcOrder - 1) {
                case 0x1f:
                  iVar8 = pResult[-0x20] * coefficients[0x1f];
                case 0x1e:
                  iVar8 = iVar8 + pResult[-0x1f] * coefficients[0x1e];
                case 0x1d:
                  iVar8 = iVar8 + pResult[-0x1e] * coefficients[0x1d];
                case 0x1c:
                  iVar8 = iVar8 + pResult[-0x1d] * coefficients[0x1c];
                case 0x1b:
                  iVar8 = iVar8 + pResult[-0x1c] * coefficients[0x1b];
                case 0x1a:
                  iVar8 = iVar8 + pResult[-0x1b] * coefficients[0x1a];
                case 0x19:
                  iVar8 = iVar8 + pResult[-0x1a] * coefficients[0x19];
                case 0x18:
                  iVar8 = iVar8 + pResult[-0x19] * coefficients[0x18];
                case 0x17:
                  iVar8 = iVar8 + pResult[-0x18] * coefficients[0x17];
                case 0x16:
                  iVar8 = iVar8 + pResult[-0x17] * coefficients[0x16];
                case 0x15:
                  iVar8 = iVar8 + pResult[-0x16] * coefficients[0x15];
                case 0x14:
                  iVar8 = iVar8 + pResult[-0x15] * coefficients[0x14];
                case 0x13:
                  iVar8 = iVar8 + pResult[-0x14] * coefficients[0x13];
                case 0x12:
                  iVar8 = iVar8 + pResult[-0x13] * coefficients[0x12];
                case 0x11:
                  iVar8 = iVar8 + pResult[-0x12] * coefficients[0x11];
                case 0x10:
                  iVar8 = iVar8 + pResult[-0x11] * coefficients[0x10];
                case 0xf:
                  iVar8 = iVar8 + pResult[-0x10] * coefficients[0xf];
                case 0xe:
                  iVar8 = iVar8 + pResult[-0xf] * coefficients[0xe];
                case 0xd:
                  iVar8 = iVar8 + pResult[-0xe] * coefficients[0xd];
                case 0xc:
                  iVar8 = iVar8 + pResult[-0xd] * coefficients[0xc];
                case 0xb:
                  iVar8 = iVar8 + pResult[-0xc] * coefficients[0xb];
                case 10:
                  iVar8 = iVar8 + pResult[-0xb] * coefficients[10];
                case 9:
                  iVar8 = iVar8 + pResult[-10] * coefficients[9];
                case 8:
                  iVar8 = iVar8 + pResult[-9] * coefficients[8];
                case 7:
                  iVar8 = iVar8 + pResult[-8] * coefficients[7];
                case 6:
                  iVar8 = iVar8 + pResult[-7] * coefficients[6];
                case 5:
                  iVar8 = iVar8 + pResult[-6] * coefficients[5];
                case 4:
                  iVar8 = iVar8 + pResult[-5] * coefficients[4];
                case 3:
                  iVar8 = iVar8 + pResult[-4] * coefficients[3];
                case 2:
                  iVar8 = iVar8 + pResult[-3] * coefficients[2];
                case 1:
                  iVar8 = iVar8 + pResult[-2] * coefficients[1];
                case 0:
                  iVar8 = iVar8 + pResult[-1] * *coefficients;
                default:
                  mVar2 = iVar8 >> ((byte)local_7c & 0x1f);
                }
              }
              else {
                lVar4 = 0;
                switch(lpcOrder - 1) {
                case 0x1f:
                  lVar4 = (long)pResult[-0x20] * (long)coefficients[0x1f];
                case 0x1e:
                  lVar4 = lVar4 + (long)pResult[-0x1f] * (long)coefficients[0x1e];
                case 0x1d:
                  lVar4 = lVar4 + (long)pResult[-0x1e] * (long)coefficients[0x1d];
                case 0x1c:
                  lVar4 = lVar4 + (long)pResult[-0x1d] * (long)coefficients[0x1c];
                case 0x1b:
                  lVar4 = lVar4 + (long)pResult[-0x1c] * (long)coefficients[0x1b];
                case 0x1a:
                  lVar4 = lVar4 + (long)pResult[-0x1b] * (long)coefficients[0x1a];
                case 0x19:
                  lVar4 = lVar4 + (long)pResult[-0x1a] * (long)coefficients[0x19];
                case 0x18:
                  lVar4 = lVar4 + (long)pResult[-0x19] * (long)coefficients[0x18];
                case 0x17:
                  lVar4 = lVar4 + (long)pResult[-0x18] * (long)coefficients[0x17];
                case 0x16:
                  lVar4 = lVar4 + (long)pResult[-0x17] * (long)coefficients[0x16];
                case 0x15:
                  lVar4 = lVar4 + (long)pResult[-0x16] * (long)coefficients[0x15];
                case 0x14:
                  lVar4 = lVar4 + (long)pResult[-0x15] * (long)coefficients[0x14];
                case 0x13:
                  lVar4 = lVar4 + (long)pResult[-0x14] * (long)coefficients[0x13];
                case 0x12:
                  lVar4 = lVar4 + (long)pResult[-0x13] * (long)coefficients[0x12];
                case 0x11:
                  lVar4 = lVar4 + (long)pResult[-0x12] * (long)coefficients[0x11];
                case 0x10:
                  lVar4 = lVar4 + (long)pResult[-0x11] * (long)coefficients[0x10];
                case 0xf:
                  lVar4 = lVar4 + (long)pResult[-0x10] * (long)coefficients[0xf];
                case 0xe:
                  lVar4 = lVar4 + (long)pResult[-0xf] * (long)coefficients[0xe];
                case 0xd:
                  lVar4 = lVar4 + (long)pResult[-0xe] * (long)coefficients[0xd];
                case 0xc:
                  lVar4 = lVar4 + (long)pResult[-0xd] * (long)coefficients[0xc];
                case 0xb:
                  lVar4 = lVar4 + (long)pResult[-0xc] * (long)coefficients[0xb];
                case 10:
                  lVar4 = lVar4 + (long)pResult[-0xb] * (long)coefficients[10];
                case 9:
                  lVar4 = lVar4 + (long)pResult[-10] * (long)coefficients[9];
                case 8:
                  lVar4 = lVar4 + (long)pResult[-9] * (long)coefficients[8];
                case 7:
                  lVar4 = lVar4 + (long)pResult[-8] * (long)coefficients[7];
                case 6:
                  lVar4 = lVar4 + (long)pResult[-7] * (long)coefficients[6];
                case 5:
                  lVar4 = lVar4 + (long)pResult[-6] * (long)coefficients[5];
                case 4:
                  lVar4 = lVar4 + (long)pResult[-5] * (long)coefficients[4];
                case 3:
                  lVar4 = lVar4 + (long)pResult[-4] * (long)coefficients[3];
                case 2:
                  lVar4 = lVar4 + (long)pResult[-3] * (long)coefficients[2];
                case 1:
                  lVar4 = lVar4 + (long)pResult[-2] * (long)coefficients[1];
                case 0:
                  lVar4 = lVar4 + (long)pResult[-1] * (long)*coefficients;
                default:
                  mVar2 = (ma_bool32)(lVar4 >> ((byte)local_38 & 0x3f));
                }
              }
              *pResult = *pResult + mVar2;
              pResult = pResult + 1;
              uVar7 = uVar7 - 1;
              bVar6 = local_7e;
              iVar8 = local_64;
              mVar3 = local_60;
            } while (uVar7 != 0);
          }
        }
        if (iVar8 == 1) {
          return mVar2;
        }
        iVar8 = iVar8 + -1;
        local_70 = local_70 + local_58;
        if ((char)local_74 != '\0') {
          mVar3 = local_68;
        }
      } while( true );
    }
  }
  return mVar3;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 blockSize, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pDecodedSamples)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    MA_DR_FLAC_ASSERT(pDecodedSamples != NULL);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    pDecodedSamples += lpcOrder;
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) < lpcOrder) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - lpcOrder;
    partitionsRemaining = (1 << partitionOrder);
    for (;;) {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__decode_samples_with_residual__rice(bs, bitsPerSample, samplesInPartition, riceParam, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__decode_samples_with_residual__unencoded(bs, bitsPerSample, samplesInPartition, unencodedBitsPerSample, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        }
        pDecodedSamples += samplesInPartition;
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        if (partitionOrder != 0) {
            samplesInPartition = blockSize / (1 << partitionOrder);
        }
    }
    return MA_TRUE;
}